

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

void __thiscall re2::SparseArray<int>::SparseArray(SparseArray<int> *this,int max_size)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  int *piVar4;
  reference pvVar5;
  int local_28;
  int i;
  int max_size_local;
  SparseArray<int> *this_local;
  
  std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
  ::vector(&this->dense_);
  this->max_size_ = max_size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)max_size;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  piVar4 = (int *)operator_new__(uVar3);
  this->sparse_to_dense_ = piVar4;
  std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
  ::resize(&this->dense_,(long)max_size);
  bVar2 = InitMemory();
  if (bVar2) {
    for (local_28 = 0; local_28 < max_size; local_28 = local_28 + 1) {
      this->sparse_to_dense_[local_28] = -0x54545455;
      pvVar5 = std::
               vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
               ::operator[](&this->dense_,(long)local_28);
      pvVar5->index_ = -0x54545455;
    }
  }
  this->size_ = 0;
  DebugCheckInvariants(this);
  return;
}

Assistant:

SparseArray<Value>::SparseArray(int max_size) {
  max_size_ = max_size;
  sparse_to_dense_ = new int[max_size];
  dense_.resize(max_size);
  // Don't need to zero the new memory, but appease Valgrind.
  if (InitMemory()) {
    for (int i = 0; i < max_size; i++) {
      sparse_to_dense_[i] = 0xababababU;
      dense_[i].index_ = 0xababababU;
    }
  }
  size_ = 0;
  DebugCheckInvariants();
}